

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * cast_expression(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  uint uVar2;
  symbol *psVar3;
  expression *cast_init_expr;
  token *ptVar4;
  undefined8 in_RCX;
  ulong uVar5;
  expression *local_48;
  expression *v;
  symbol *sym;
  int is_force;
  
  if ((((ulong)token->pos & 0x3f) != 0x11) || ((token->field_2).special != 0x28)) goto LAB_00109b41;
  ptVar4 = token->next;
  uVar2 = *(uint *)&ptVar4->pos & 0x3f;
  psVar3 = (symbol *)(ulong)uVar2;
  if ((uVar2 == 2) &&
     (psVar3 = dmrC_lookup_symbol((ptVar4->field_2).ident,NS_SYMBOL|NS_TYPEDEF),
     psVar3 != (symbol *)0x0)) {
    uVar5 = CONCAT71((int7)((ulong)in_RCX >> 8),psVar3->field_0x1) & 0xffffffffffffff02;
    uVar5 = CONCAT71((int7)(uVar5 >> 8),(byte)uVar5 >> 1);
  }
  else {
    uVar5 = 0;
  }
  if ((char)uVar5 != '\0') {
    sym._4_4_ = (uint)uVar5;
    pVar1 = ptVar4->pos;
    cast_init_expr = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)cast_init_expr = 0xb;
    cast_init_expr->pos = pVar1;
    ptVar4 = dmrC_typename(C,ptVar4,(symbol **)&v,(int *)&sym);
    (cast_init_expr->field_5).field_3.unop = v;
    ptVar4 = dmrC_expect_token(C,ptVar4,0x29,"at end of cast operator");
    if ((((ulong)ptVar4->pos & 0x3f) == 0x11) && ((ptVar4->field_2).special == 0x7b)) {
      if ((int)sym != 0) {
        dmrC_warning(C,*(position *)&v->op,"[force] in compound literal");
      }
      token = dmrC_initializer(C,&(cast_init_expr->field_5).field_6.right,ptVar4);
      psVar3 = (symbol *)postfix_expression(C,token,tree,cast_init_expr);
    }
    else {
      *tree = cast_init_expr;
      if ((int)sym != 0) {
        *(undefined1 *)cast_init_expr = 0xc;
      }
      psVar3 = (symbol *)cast_expression(C,ptVar4,&local_48);
      token = (token *)psVar3;
      if (local_48 != (expression *)0x0) {
        (cast_init_expr->field_5).field_2.string = (string *)local_48;
        uVar5 = (ulong)sym._4_4_;
        if ((*(ushort *)local_48 >> 8 & 1) == 0) {
          if ((*(ushort *)local_48 >> 8 & 2) != 0) {
            cast_init_expr->field_0x1 = 3;
          }
        }
        else {
          cast_init_expr->field_0x1 = 1;
        }
        goto LAB_00109b3d;
      }
    }
    uVar5 = (ulong)sym._4_4_;
  }
LAB_00109b3d:
  if ((char)uVar5 != '\0') {
    return (token *)psVar3;
  }
LAB_00109b41:
  ptVar4 = unary_expression(C,token,tree);
  return ptVar4;
}

Assistant:

static struct token *cast_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	if (dmrC_match_op(token, '(')) {
		struct token *next = token->next;
		if (dmrC_lookup_type(next)) {
			struct expression *cast = dmrC_alloc_expression(C, next->pos, EXPR_CAST);
			struct expression *v;
			struct symbol *sym;
			int is_force;

			token = dmrC_typename(C, next, &sym, &is_force);
			cast->cast_type = sym;
			token = dmrC_expect_token(C, token, ')', "at end of cast operator");
			if (dmrC_match_op(token, '{')) {
				if (is_force)
					dmrC_warning(C, sym->pos,
						"[force] in compound literal");
				token = dmrC_initializer(C, &cast->cast_expression, token);
				return postfix_expression(C, token, tree, cast);
			}
			*tree = cast;
			if (is_force)
				cast->type = EXPR_FORCE_CAST;
			token = cast_expression(C, token, &v);
			if (!v)
				return token;
			cast->cast_expression = v;
			if (v->flags & Int_const_expr)
				cast->flags = Int_const_expr;
			else if (v->flags & Float_literal) /* and _not_ int */
				cast->flags = Int_const_expr | Float_literal;
			return token;
		}
	}
	return unary_expression(C, token, tree);
}